

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void wstran_connect_cb(void *arg)

{
  nng_err nVar1;
  int iVar2;
  nni_aio *aio;
  nni_aio *aio_00;
  nni_taskq *local_40;
  nng_stream *ws;
  int rv;
  nni_aio *uaio;
  nni_aio *caio;
  ws_pipe *p;
  ws_dialer *d;
  void *arg_local;
  
  aio = (nni_aio *)((long)arg + 0x48);
  local_40 = (nni_taskq *)0x0;
  p = (ws_pipe *)arg;
  d = (ws_dialer *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  nVar1 = nni_aio_result(aio);
  if (nVar1 == NNG_OK) {
    local_40 = (nni_taskq *)nni_aio_get_output(aio,0);
  }
  aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)&(p->mtx).mtx + 8));
  if (aio_00 == (nni_aio *)0x0) {
    nng_stream_free((nng_stream *)local_40);
    nni_mtx_unlock((nni_mtx *)&(p->mtx).mtx.__data.__list.__next);
  }
  else {
    nni_aio_list_remove(aio_00);
    iVar2 = nni_list_empty((nni_list *)((long)&(p->mtx).mtx + 8));
    if (iVar2 == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/websocket.c"
                ,0x192,"nni_list_empty(&d->aios)");
    }
    nVar1 = nni_aio_result(aio);
    if (nVar1 == NNG_OK) {
      nVar1 = nni_pipe_alloc_dialer(&caio,*(nni_dialer **)&(p->rxaio).a_timeout);
      if (nVar1 == NNG_OK) {
        *(undefined2 *)((long)&(caio->a_task).task_node.ln_prev + 2) = *(undefined2 *)&(p->mtx).mtx;
        caio[2].a_task.task_tq = local_40;
        nni_aio_set_output(aio_00,0,*(void **)&caio[2].a_task.task_busy);
        nni_aio_finish(aio_00,NNG_OK,0);
      }
      else {
        nng_stream_free((nng_stream *)local_40);
        nni_aio_finish_error(aio_00,nVar1);
      }
    }
    else {
      nni_aio_finish_error(aio_00,nVar1);
    }
    nni_mtx_unlock((nni_mtx *)&(p->mtx).mtx.__data.__list.__next);
  }
  return;
}

Assistant:

static void
wstran_connect_cb(void *arg)
{
	ws_dialer  *d = arg;
	ws_pipe    *p;
	nni_aio    *caio = &d->connaio;
	nni_aio    *uaio;
	int         rv;
	nng_stream *ws = NULL;

	nni_mtx_lock(&d->mtx);
	if (nni_aio_result(caio) == 0) {
		ws = nni_aio_get_output(caio, 0);
	}
	if ((uaio = nni_list_first(&d->aios)) == NULL) {
		// The client stopped caring about this!
		nng_stream_free(ws);
		nni_mtx_unlock(&d->mtx);
		return;
	}
	nni_aio_list_remove(uaio);
	NNI_ASSERT(nni_list_empty(&d->aios));
	if ((rv = nni_aio_result(caio)) != 0) {
		nni_aio_finish_error(uaio, rv);
	} else if ((rv = nni_pipe_alloc_dialer((void **) &p, d->ndialer)) !=
	    0) {
		nng_stream_free(ws);
		nni_aio_finish_error(uaio, rv);
	} else {
		p->peer = d->peer;
		p->ws   = ws;

		nni_aio_set_output(uaio, 0, p->npipe);
		nni_aio_finish(uaio, 0, 0);
	}
	nni_mtx_unlock(&d->mtx);
}